

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O1

int Dau_Dsd6DecomposeTripleVars(Dau_Dsd_t *p,word *pTruth,int *pVars,int nVars)

{
  ulong uVar1;
  char (*pacVar2) [32];
  int iVar3;
  int iVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint nVars_00;
  size_t sVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  char (*pacVar13) [32];
  long lVar14;
  ulong uVar15;
  word *pwVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  char *pcVar21;
  ulong uVar22;
  uint uVar23;
  bool bVar24;
  word tCof0;
  timespec ts;
  uint local_d7c;
  long local_d68;
  word local_d40;
  word local_d38;
  char (*local_d30) [8];
  Dau_Dsd_t local_d28;
  
  iVar6 = clock_gettime(3,(timespec *)&local_d28);
  if (iVar6 < 0) {
    local_d68 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) *
                    SEXT816(CONCAT44(local_d28.nSizeNonDec,local_d28.nPos)),8);
    local_d68 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_d28._0_8_ * -1000000;
  }
  pacVar2 = p->Cache;
  local_d30 = p->pVarDefs;
  do {
    nVars_00 = nVars;
    if (0 < nVars) {
      uVar20 = (ulong)(uint)nVars;
      do {
        pwVar16 = s_Truths6Neg;
        if (6 < uVar20) {
LAB_00508852:
          __assert_fail("iVar >= 0 && iVar < 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                        ,0x337,"word Abc_Tt6Cofactor0(word, int)");
        }
        uVar1 = uVar20 - 1;
        uVar22 = s_Truths6Neg[uVar1];
        uVar17 = uVar22 & *pTruth;
        bVar12 = (byte)uVar1 & 0x1f;
        bVar10 = (byte)(1 << bVar12);
        uVar15 = *pTruth & s_Truths6[uVar1];
        if ((int)nVars_00 < 1) {
          uVar23 = 0 << bVar12;
        }
        else {
          uVar17 = uVar17 << (bVar10 & 0x3f) | uVar17;
          uVar15 = uVar15 >> (bVar10 & 0x3f) | uVar15;
          bVar12 = 0;
          uVar18 = 0;
          uVar23 = 0;
          do {
            if (uVar20 - 1 != uVar18) {
              if (p == (Dau_Dsd_t *)0x0) {
                iVar6 = 0;
              }
              else {
                iVar6 = (int)pacVar2[pVars[uVar1]][pVars[uVar18]];
              }
              if ((iVar6 == 0) &&
                 (bVar11 = (byte)(1 << ((byte)uVar18 & 0x1f)),
                 iVar6 = (uint)((*pwVar16 & (uVar17 >> (bVar11 & 0x3f) ^ uVar17)) != 0) +
                         (uint)((*pwVar16 & (uVar15 >> (bVar11 & 0x3f) ^ uVar15)) != 0) * 2,
                 p != (Dau_Dsd_t *)0x0)) {
                iVar3 = pVars[uVar1];
                iVar4 = pVars[uVar18];
                if (iVar3 == iVar4) {
                  __assert_fail("v != u",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                                ,0x459,"void Dau_DsdInsertVarCache(Dau_Dsd_t *, int, int, int)");
                }
                if (2 < iVar6 - 1U) {
                  __assert_fail("Status > 0 && Status < 4",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                                ,0x45a,"void Dau_DsdInsertVarCache(Dau_Dsd_t *, int, int, int)");
                }
                if (pacVar2[iVar3][iVar4] != '\0') {
                  __assert_fail("p->Cache[v][u] == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                                ,0x45b,"void Dau_DsdInsertVarCache(Dau_Dsd_t *, int, int, int)");
                }
                pacVar2[iVar3][iVar4] = (char)iVar6;
              }
              uVar23 = uVar23 | iVar6 << (bVar12 & 0x1f);
            }
            uVar18 = uVar18 + 1;
            pwVar16 = pwVar16 + 1;
            bVar12 = bVar12 + 2;
          } while (nVars_00 != uVar18);
        }
        if ((uVar23 & uVar23 >> 1 & 0x55555555) == 0) {
          local_d28.fSplitPrime = 0;
          local_d28.fWriteTruth = p->fWriteTruth;
          iVar6 = pVars[uVar1];
          lVar14 = (long)(int)nVars_00;
          pVars[uVar1] = pVars[lVar14 + -1];
          pVars[lVar14 + -1] = iVar6;
          Abc_TtSwapVars(pTruth,nVars_00,(int)uVar1,nVars_00 - 1);
          if (5 < nVars_00 - 1) goto LAB_00508852;
          uVar22 = lVar14 - 1;
          local_d38 = s_Truths6Neg[uVar22 & 0xffffffff] & *pTruth;
          bVar12 = (byte)(1 << ((byte)uVar22 & 0x1f));
          local_d38 = local_d38 << (bVar12 & 0x3f) | local_d38;
          local_d40 = *pTruth & s_Truths6[uVar22 & 0xffffffff];
          local_d40 = local_d40 >> (bVar12 & 0x3f) | local_d40;
          iVar6 = p->nPos;
          p->nPos = iVar6 + 1;
          p->pOutput[iVar6] = '<';
          Dau_DsdWriteVar(p,pVars[uVar22],0);
          Dau_DsdDecomposeInt(&local_d28,&local_d40,(int)uVar22);
          if (local_d28.pOutput[0] != 0) {
            pcVar21 = local_d28.pOutput;
            bVar12 = local_d28.pOutput[0];
            do {
              pcVar21 = pcVar21 + 1;
              if (((char)bVar12 < 'a') || ((int)(nVars_00 | 0x60) <= (int)(uint)bVar12)) {
                iVar6 = p->nPos;
                p->nPos = iVar6 + 1;
                p->pOutput[iVar6] = bVar12;
              }
              else {
                Dau_DsdWriteVar(p,pVars[(ulong)bVar12 - 0x61],0);
              }
              bVar12 = *pcVar21;
            } while (bVar12 != 0);
          }
          p->nSizeNonDec = local_d28.nSizeNonDec;
          if (local_d28.nSizeNonDec != 0) {
            *pTruth = local_d40;
          }
          Dau_DsdDecomposeInt(&local_d28,&local_d38,(int)uVar22);
          if (local_d28.pOutput[0] != 0) {
            pcVar21 = local_d28.pOutput;
            bVar12 = local_d28.pOutput[0];
            do {
              pcVar21 = pcVar21 + 1;
              if (((char)bVar12 < 'a') || ((int)(nVars_00 | 0x60) <= (int)(uint)bVar12)) {
                iVar6 = p->nPos;
                p->nPos = iVar6 + 1;
                p->pOutput[iVar6] = bVar12;
              }
              else {
                Dau_DsdWriteVar(p,pVars[(ulong)bVar12 - 0x61],0);
              }
              bVar12 = *pcVar21;
            } while (bVar12 != 0);
          }
          iVar6 = p->nPos;
          p->nPos = iVar6 + 1;
          p->pOutput[iVar6] = '>';
          iVar6 = p->nSizeNonDec;
          if (p->nSizeNonDec <= local_d28.nSizeNonDec) {
            iVar6 = local_d28.nSizeNonDec;
          }
          p->nSizeNonDec = iVar6;
          if (local_d28.nSizeNonDec != 0) {
            *pTruth = local_d38;
          }
          bVar5 = false;
          iVar6 = 1;
          local_d7c = 0;
        }
        else {
          uVar19 = ~uVar23 >> 1 & uVar23;
          uVar7 = uVar19 & 0x55555555;
          uVar8 = uVar7 - 1;
          iVar6 = 0;
          bVar5 = true;
          if ((uVar8 < (uVar7 ^ uVar8)) &&
             (uVar7 = ~uVar23 & uVar23 >> 1, uVar8 = uVar7 & 0x55555555, uVar23 = uVar8 - 1,
             iVar6 = 0, bVar5 = true, uVar23 < (uVar8 ^ uVar23))) {
            uVar19 = uVar19 & 0x55555555;
            if (uVar19 == 0) {
LAB_00508871:
              __assert_fail("Supp > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                            ,0x567,"int Abc_TtSuppFindFirst(int)");
            }
            uVar23 = 0;
            do {
              if ((uVar19 >> (uVar23 & 0x1f) & 1) != 0) goto LAB_00508146;
              uVar23 = uVar23 + 1;
            } while (uVar23 != 0x20);
            uVar23 = 0xffffffff;
LAB_00508146:
            uVar7 = uVar7 & 0x55555555;
            if (uVar7 == 0) goto LAB_00508871;
            uVar23 = (int)uVar23 >> 1;
            uVar8 = 0;
            do {
              if ((uVar7 >> (uVar8 & 0x1f) & 1) != 0) goto LAB_0050816c;
              uVar8 = uVar8 + 1;
            } while (uVar8 != 0x20);
            uVar8 = 0xffffffff;
LAB_0050816c:
            uVar15 = s_Truths6[uVar1] & *pTruth;
            if ((5 < uVar23) || (uVar8 = (int)uVar8 >> 1, 5 < uVar8)) goto LAB_00508852;
            uVar15 = uVar15 >> (bVar10 & 0x3f) | uVar15;
            uVar22 = *pTruth & uVar22;
            uVar22 = uVar22 << (bVar10 & 0x3f) | uVar22;
            uVar17 = s_Truths6[uVar23] & uVar22;
            bVar12 = (byte)(1 << ((byte)uVar23 & 0x1f));
            uVar22 = uVar22 & s_Truths6Neg[uVar23];
            uVar18 = s_Truths6Neg[uVar8] & uVar15;
            bVar10 = (byte)(1 << ((byte)uVar8 & 0x1f));
            uVar17 = uVar17 >> (bVar12 & 0x3f) | uVar17;
            uVar15 = uVar15 & s_Truths6[uVar8];
            uVar22 = uVar22 << (bVar12 & 0x3f) | uVar22;
            uVar18 = uVar18 << (bVar10 & 0x3f) | uVar18;
            uVar15 = uVar15 >> (bVar10 & 0x3f) | uVar15;
            if ((uVar17 == uVar15 && uVar22 == uVar18) ||
               (uVar7 = nVars_00, uVar17 == uVar18 && uVar22 == uVar15)) {
              iVar6 = pVars[uVar23];
              *pTruth = (uVar15 ^ uVar18) & s_Truths6[uVar1] ^ uVar18;
              pcVar21 = "";
              if (uVar17 == uVar18 && uVar22 == uVar15) {
                pcVar21 = "!";
              }
              sprintf((char *)&local_d28,"<%c%c%s%c>",(ulong)(pVars[uVar1] + 0x61),
                      (ulong)(pVars[uVar8] + 0x61),pcVar21,(ulong)(iVar6 + 0x61));
              sVar9 = strlen((char *)&local_d28);
              if (7 < sVar9) {
                __assert_fail("strlen(pStr) < 8",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                              ,0x445,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
              }
              uVar23 = p->nVarsUsed;
              uVar22 = (ulong)uVar23;
              if (0x1f < (int)uVar23) {
                __assert_fail("p->nVarsUsed < 32",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                              ,0x446,"int Dau_DsdAddVarDef(Dau_Dsd_t *, char *)");
              }
              if (0 < (int)uVar23) {
                lVar14 = 0;
                do {
                  pacVar2[(int)uVar22][lVar14] = '\0';
                  lVar14 = lVar14 + 1;
                  uVar22 = (ulong)p->nVarsUsed;
                } while (lVar14 < (long)uVar22);
              }
              uVar23 = p->nVarsUsed;
              uVar22 = (ulong)uVar23;
              if (0 < (int)uVar23) {
                lVar14 = 0;
                pacVar13 = pacVar2;
                do {
                  (*pacVar13)[(int)uVar22] = '\0';
                  lVar14 = lVar14 + 1;
                  uVar23 = p->nVarsUsed;
                  uVar22 = (ulong)(int)uVar23;
                  pacVar13 = pacVar13 + 1;
                } while (lVar14 < (long)uVar22);
              }
              p->nVarsUsed = uVar23 + 1;
              strcpy(local_d30[(int)uVar23],(char *)&local_d28);
              pVars[uVar1] = p->nVarsUsed + -1;
              iVar3 = pVars[uVar8];
              uVar23 = nVars_00 - 1;
              pVars[uVar8] = pVars[(long)(int)nVars_00 + -1];
              pVars[(long)(int)nVars_00 + -1] = iVar3;
              Abc_TtSwapVars(pTruth,nVars_00,uVar8,uVar23);
              if ((int)nVars_00 < 2) {
LAB_005087d6:
                __assert_fail("v < nVars",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauDsd.c"
                              ,0x454,"int Dau_DsdFindVarDef(int *, int, int)");
              }
              uVar22 = 0;
              while (pVars[uVar22] != iVar6) {
                uVar22 = uVar22 + 1;
                if (uVar23 == uVar22) goto LAB_005087d6;
              }
              iVar6 = pVars[uVar22];
              uVar7 = nVars_00 - 2;
              pVars[uVar22] = pVars[(long)(int)nVars_00 + -2];
              pVars[(long)(int)nVars_00 + -2] = iVar6;
              Abc_TtSwapVars(pTruth,uVar23,(int)uVar22,uVar7);
              if (nVars_00 == 2) goto LAB_005087d6;
              uVar22 = 0;
              while (pVars[uVar22] != p->nVarsUsed + -1) {
                uVar22 = uVar22 + 1;
                if (uVar7 == uVar22) goto LAB_005087d6;
              }
              iVar6 = Dau_Dsd6DecomposeSingleVarOne(p,pTruth,pVars,uVar7,(int)uVar22);
              if (iVar6 != 0) {
                uVar7 = Dau_Dsd6DecomposeSingleVar(p,pTruth,pVars,nVars_00 - 3);
              }
            }
            if (uVar7 == nVars_00) {
              iVar6 = 6;
              bVar5 = false;
            }
            else {
              if (uVar7 == 0) {
                iVar6 = clock_gettime(3,(timespec *)&local_d28);
                if (iVar6 < 0) {
                  lVar14 = -1;
                }
                else {
                  lVar14 = CONCAT44(local_d28.nSizeNonDec,local_d28.nPos) / 1000 +
                           local_d28._0_8_ * 1000000;
                }
                s_Times_2 = s_Times_2 + lVar14 + local_d68;
              }
              else {
                nVars_00 = Dau_Dsd6DecomposeDoubleVars(p,pTruth,pVars,uVar7);
                if (nVars_00 != 0) {
                  iVar6 = 4;
                  bVar5 = false;
                  goto LAB_00508587;
                }
                iVar6 = clock_gettime(3,(timespec *)&local_d28);
                if (iVar6 < 0) {
                  lVar14 = -1;
                }
                else {
                  lVar14 = CONCAT44(local_d28.nSizeNonDec,local_d28.nPos) / 1000 +
                           local_d28._0_8_ * 1000000;
                }
                s_Times_2 = s_Times_2 + lVar14 + local_d68;
                nVars_00 = 0;
              }
              bVar5 = false;
              iVar6 = 1;
              local_d7c = 0;
            }
          }
        }
LAB_00508587:
        if ((iVar6 != 0) && (iVar6 != 6)) {
          nVars = nVars_00;
          if (iVar6 != 4) goto LAB_005087b8;
          nVars = (int)uVar20;
          goto LAB_0050875a;
        }
        bVar5 = 1 < (long)uVar20;
        uVar20 = uVar1;
      } while (bVar5);
      nVars = 0;
    }
LAB_0050875a:
    bVar5 = true;
    bVar24 = nVars == 0;
    nVars = nVars_00;
    if (bVar24) {
      iVar6 = clock_gettime(3,(timespec *)&local_d28);
      if (iVar6 < 0) {
        lVar14 = -1;
      }
      else {
        lVar14 = CONCAT44(local_d28.nSizeNonDec,local_d28.nPos) / 1000 + local_d28._0_8_ * 1000000;
      }
      s_Times_2 = s_Times_2 + lVar14 + local_d68;
      bVar5 = false;
      local_d7c = nVars_00;
    }
LAB_005087b8:
    if (!bVar5) {
      return local_d7c;
    }
  } while( true );
}

Assistant:

int Dau_Dsd6DecomposeTripleVars( Dau_Dsd_t * p, word  * pTruth, int * pVars, int nVars )
{
    abctime clk = Abc_Clock();
    while ( 1 )
    {
        int v;
//        Kit_DsdPrintFromTruth( (unsigned *)pTruth, 6 ); printf( "\n" );
        for ( v = nVars - 1; v >= 0; v-- )
        {
            unsigned uSupports = Dau_Dsd6FindSupports( p, pTruth, pVars, nVars, v );
//            Dau_DsdPrintSupports( uSupports, nVars );
            if ( (uSupports & (uSupports >> 1) & 0x55555555) == 0 ) // non-overlapping supports
                return Dau_Dsd6DecomposeTripleVarsOuter( p, pTruth, pVars, nVars, v );
            if ( Abc_TtSuppOnlyOne( uSupports & (~uSupports >> 1) & 0x55555555) &&
                 Abc_TtSuppOnlyOne(~uSupports & ( uSupports >> 1) & 0x55555555) ) // one unique variable in each cofactor
            {
                int nVarsNew = Dau_Dsd6DecomposeTripleVarsInner( p, pTruth, pVars, nVars, v, uSupports );
                if ( nVarsNew == nVars )
                    continue;
                if ( nVarsNew == 0 )
                {
                    s_Times[2] += Abc_Clock() - clk;
                    return 0;
                }
                nVars = Dau_Dsd6DecomposeDoubleVars( p, pTruth, pVars, nVarsNew );
                if ( nVars == 0 )
                {
                    s_Times[2] += Abc_Clock() - clk;
                    return 0;
                }
                break;
            }
        }
        if ( v == -1 )
        {
            s_Times[2] += Abc_Clock() - clk;
            return nVars;
        }
    }
    assert( 0 );
    return -1;
}